

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,MoreThanOneExpression *ptr)

{
  pointer ppEVar1;
  Expr *second;
  pointer ppEVar2;
  string local_58;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"mnogo expr",&local_31);
  box(this,ptr,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  ppEVar1 = (ptr->super_Expressions).exprs.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar2 = (ptr->super_Expressions).exprs.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1
      ) {
    second = *ppEVar2;
    arrow(this,ptr,second);
    (**(second->super_Base)._vptr_Base)(second,this);
  }
  return;
}

Assistant:

void gv_visitor::visit(MoreThanOneExpression* ptr) {
    box(ptr, "mnogo expr");
    for(auto i: ptr->exprs) {
        arrow(ptr, i);
        i->accept(this);
    }
}